

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

ostream * operator<<(ostream *stream,Graph *g)

{
  bool bVar1;
  reference e_00;
  ostream *this;
  Edge *e;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> *__range1;
  Graph *g_local;
  ostream *stream_local;
  
  __end1 = std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::begin(&g->edges);
  e = (Edge *)std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::end(&g->edges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
                                *)&e);
    if (!bVar1) break;
    e_00 = __gnu_cxx::
           __normal_iterator<const_Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
           ::operator*(&__end1);
    this = operator<<(stream,&e_00->super_LightEdge);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
    ::operator++(&__end1);
  }
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const Graph &g) {
    for (auto &e : g.edges)
        stream << e << std::endl;
    return stream;
}